

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

void __thiscall
DemoScripts::TrainVanillaIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  INeuron *pIVar5;
  reference this_00;
  reference pvVar6;
  ILayer *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar8;
  value_type extraout_XMM0_Da;
  float local_794;
  vector<float,_std::allocator<float>_> local_698;
  vector<float,_std::allocator<float>_> local_678;
  float local_65c;
  ulong uStack_658;
  float loss;
  size_t idx;
  undefined1 local_648 [8];
  vector<float,_std::allocator<float>_> result;
  undefined1 local_628 [4];
  float S;
  vector<float,_std::allocator<float>_> softMax;
  vector<float,_std::allocator<float>_> deltas;
  int activationId;
  int sampleId;
  float totalLoss;
  int epochId;
  float SIMULATION_TIME;
  float LEARNING_RATE;
  float EPS;
  undefined1 local_5b8 [8];
  Dataset data;
  VanillaSynapseBuilder synapseBuilder;
  allocator local_541;
  LayerMeta local_540;
  undefined1 local_500 [8];
  DenseVanillaLayer output;
  LayerMeta local_398;
  undefined1 local_358 [8];
  DenseVanillaLayer hidden;
  allocator local_1e1;
  LayerMeta local_1e0;
  undefined1 local_1a0 [8];
  DenseVanillaLayer input;
  BasicNeuronBuilder neuronBuilder;
  size_t IRIS_OUTPUT;
  size_t IRIS_HIDDEN;
  size_t IRIS_INPUT;
  default_random_engine *generator_local;
  char *path_local;
  DemoScripts *this_local;
  
  input.super_ILayer.meta.width = 0.0;
  input.super_ILayer.meta.zShift = 0.0;
  BasicNeuronBuilder::BasicNeuronBuilder((BasicNeuronBuilder *)&input.super_ILayer.meta.width);
  local_1e0.alpha = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0.name,"input",&local_1e1);
  local_1e0.size = 4;
  local_1e0.neuronBuilder = (INeuronBuilder *)&input.super_ILayer.meta.width;
  local_1e0.width = 0.0;
  local_1e0.zShift = 0.0;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)local_1a0,&local_1e0);
  LayerMeta::~LayerMeta(&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  local_398.alpha = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398.name,"hidden1",
             (allocator *)((long)&output.super_ILayer.meta.zShift + 3));
  local_398.size = 0xf;
  local_398.neuronBuilder = (INeuronBuilder *)&input.super_ILayer.meta.width;
  local_398.width = 0.0;
  local_398.zShift = 0.0;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)local_358,&local_398);
  LayerMeta::~LayerMeta(&local_398);
  std::allocator<char>::~allocator((allocator<char> *)((long)&output.super_ILayer.meta.zShift + 3));
  local_540.alpha = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540.name,"output",&local_541);
  local_540.size = 3;
  local_540.neuronBuilder = (INeuronBuilder *)&input.super_ILayer.meta.width;
  local_540.width = 0.0;
  local_540.zShift = 0.0;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)local_500,&local_540);
  LayerMeta::~LayerMeta(&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  sVar3 = ILayer::GetSize((ILayer *)local_358);
  DenseVanillaLayer::Init((DenseVanillaLayer *)local_1a0,sVar3,generator,0.0);
  sVar3 = ILayer::GetSize((ILayer *)local_500);
  DenseVanillaLayer::Init((DenseVanillaLayer *)local_1a0,sVar3,generator,0.0);
  DenseVanillaLayer::Init((DenseVanillaLayer *)local_1a0,0,generator,0.0);
  VanillaSynapseBuilder::VanillaSynapseBuilder
            ((VanillaSynapseBuilder *)
             &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(linear_congruential_engine *)generator);
  ILayer::BindWithNext
            ((ILayer *)local_1a0,(ILayer *)local_358,
             (ISynapseBuilder *)
             &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ILayer::BindWithNext
            ((ILayer *)local_358,(ILayer *)local_500,
             (ISynapseBuilder *)
             &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SPIKING_NN::Dataset::Dataset(local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&EPS,path,(allocator *)((long)&LEARNING_RATE + 3));
  IRIS::ReadIris((string *)&EPS,(Dataset *)local_5b8,0.2);
  std::__cxx11::string::~string((string *)&EPS);
  std::allocator<char>::~allocator((allocator<char> *)((long)&LEARNING_RATE + 3));
  DATA_CONVERSION::ConvertDataToTimings((Dataset *)local_5b8,1.0);
  for (sampleId = 0; (float)sampleId < 1000.0; sampleId = sampleId + 1) {
    activationId = 0;
    for (deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        sVar4 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        *)local_5b8),
        (ulong)(long)deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ < sVar4;
        deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      for (deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_ = 0; sVar3 = ILayer::GetSize((ILayer *)local_1a0),
          (ulong)(long)(int)deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage < sVar3;
          deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (int)deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        pIVar5 = ILayer::operator[]((ILayer *)local_1a0,
                                    (long)(int)deltas.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)local_5b8,
                               (long)deltas.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (this_00,(long)(int)deltas.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        (**pIVar5->_vptr_INeuron)(0,*pvVar6);
      }
      DenseVanillaLayer::Forward((DenseVanillaLayer *)local_358);
      DenseVanillaLayer::Forward((DenseVanillaLayer *)local_500);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_628);
      result.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      sVar3 = ILayer::GetSize((ILayer *)local_500);
      std::allocator<float>::allocator((allocator<float> *)((long)&idx + 7));
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_648,sVar3,
                 (allocator<float> *)((long)&idx + 7));
      std::allocator<float>::~allocator((allocator<float> *)((long)&idx + 7));
      for (uStack_658 = 0; uVar1 = uStack_658, sVar3 = ILayer::GetSize((ILayer *)local_500),
          uVar1 < sVar3; uStack_658 = uStack_658 + 1) {
        pIVar5 = ILayer::operator[]((ILayer *)local_500,uStack_658);
        (*pIVar5->_vptr_INeuron[4])();
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_648,uStack_658);
        *pvVar6 = extraout_XMM0_Da;
      }
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &data.xTrain.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      local_65c = SoftMaxLoss((vector<float,_std::allocator<float>_> *)local_648,*pvVar6,
                              (vector<float,_std::allocator<float>_> *)local_628,
                              (vector<float,_std::allocator<float>_> *)
                              &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (float *)((long)&result.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                       ));
      activationId = (int)((float)activationId + local_65c);
      DenseVanillaLayer::Backward
                ((DenseVanillaLayer *)local_500,
                 (vector<float,_std::allocator<float>_> *)
                 &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_678.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_678.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_678.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::vector(&local_678);
      DenseVanillaLayer::Backward((DenseVanillaLayer *)local_358,&local_678);
      local_698.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_698.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_698.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::vector(&local_698);
      DenseVanillaLayer::Backward((DenseVanillaLayer *)local_1a0,&local_698);
      std::vector<float,_std::allocator<float>_>::~vector(&local_698);
      std::vector<float,_std::allocator<float>_>::~vector(&local_678);
      DenseVanillaLayer::GradStep((DenseVanillaLayer *)local_500,1,0.1,0.1,0.0,false,0.0,false);
      DenseVanillaLayer::GradStep((DenseVanillaLayer *)local_358,1,0.1,0.1,0.0,false,0.0,false);
      DenseVanillaLayer::GradStep((DenseVanillaLayer *)local_1a0,1,0.1,0.1,0.0,true,0.0,false);
      pIVar7 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)local_500);
      iVar2 = (*pIVar7->_vptr_ILayer[7])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))();
      pIVar7 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)local_358);
      iVar2 = (*pIVar7->_vptr_ILayer[7])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))();
      pIVar7 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)local_1a0);
      iVar2 = (*pIVar7->_vptr_ILayer[7])();
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))();
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_648);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_628);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"Loss for epoch: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sampleId);
    poVar8 = std::operator<<(poVar8," is: ");
    sVar4 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_5b8);
    local_794 = (float)sVar4;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)activationId / local_794);
    std::operator<<(poVar8,"\n");
  }
  SPIKING_NN::Dataset::~Dataset(local_5b8);
  VanillaSynapseBuilder::~VanillaSynapseBuilder
            ((VanillaSynapseBuilder *)
             &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  DenseVanillaLayer::~DenseVanillaLayer((DenseVanillaLayer *)local_500);
  DenseVanillaLayer::~DenseVanillaLayer((DenseVanillaLayer *)local_358);
  DenseVanillaLayer::~DenseVanillaLayer((DenseVanillaLayer *)local_1a0);
  return;
}

Assistant:

void DemoScripts::TrainVanillaIris( char *path, std::default_random_engine &generator )
{
    size_t IRIS_INPUT = 4;
    size_t IRIS_HIDDEN = 15;
    size_t IRIS_OUTPUT = 3;

    BasicNeuronBuilder neuronBuilder = BasicNeuronBuilder();

    DenseVanillaLayer input = DenseVanillaLayer( {0, "input", IRIS_INPUT, neuronBuilder} );
    DenseVanillaLayer hidden = DenseVanillaLayer( {0, "hidden1", IRIS_HIDDEN, neuronBuilder} );
    DenseVanillaLayer output = DenseVanillaLayer( {0, "output", IRIS_OUTPUT, neuronBuilder} );

    input.Init( hidden.GetSize(), generator, 0 );
    input.Init( output.GetSize(), generator, 0 );
    input.Init( 0, generator, 0 );

    VanillaSynapseBuilder synapseBuilder = VanillaSynapseBuilder( generator );
    input.BindWithNext( hidden, synapseBuilder );
    hidden.BindWithNext( output, synapseBuilder );

    SPIKING_NN::Dataset data;
    IRIS::ReadIris( path, data, 0.2 );
    DATA_CONVERSION::ConvertDataToTimings( data, 1 );

    float EPS = 1e-1;
    float LEARNING_RATE = 0.1;
    float SIMULATION_TIME = 1000;

    for ( int epochId = 0; epochId < SIMULATION_TIME; epochId++ ) {
        float totalLoss = 0.f;
        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            for ( int activationId = 0; activationId < input.GetSize(); ++activationId ) {
                input[activationId]->ProcessInputSpike( 0, data.xTrain[sampleId][activationId] );
            }
            hidden.Forward();
            output.Forward();

            std::vector<float> deltas;
            std::vector<float> softMax;
            float S = 0;
            auto result = std::vector<float>( output.GetSize());
            for ( size_t idx = 0; idx < output.GetSize(); ++idx ) {
                result[idx] = output[idx]->GetOutput();
            }
            float loss = SoftMaxLoss( result, data.yTrain[sampleId], softMax, deltas, &S );
            totalLoss += loss;

            output.Backward( deltas ), hidden.Backward( {} ), input.Backward( {} );

            output.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            hidden.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            input.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, true, 0, false );

            output.ResetPotentials().ResetGrad().ResetStats();
            hidden.ResetPotentials().ResetGrad().ResetStats();
            input.ResetPotentials().ResetGrad().ResetStats();
        }
        std::cout << "Loss for epoch: " << epochId << " is: " << totalLoss / data.xTrain.size() << "\n";
    }
}